

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O3

bool Kernel::TermList::equals(TermList t1,TermList t2)

{
  TermList **ppTVar1;
  uint uVar2;
  TermList *pTVar3;
  TermList *pTVar4;
  int iVar5;
  Term *t;
  
  if ((equals(Kernel::TermList,Kernel::TermList)::stack == '\0') &&
     (iVar5 = __cxa_guard_acquire(&equals(Kernel::TermList,Kernel::TermList)::stack), iVar5 != 0)) {
    equals::stack._capacity = 8;
    equals::stack._stack =
         (TermList **)
         Lib::FixedSizeAllocator<64UL>::alloc
                   ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    equals::stack._end = equals::stack._stack + equals::stack._capacity;
    equals::stack._cursor = equals::stack._stack;
    __cxa_atexit(Lib::Stack<Kernel::TermList_*>::~Stack,&equals::stack,&__dso_handle);
    __cxa_guard_release(&equals(Kernel::TermList,Kernel::TermList)::stack);
  }
  while( true ) {
    if (((((uint)t1._content | (uint)t2._content) & 3) == 0) &&
       (((*(byte *)(t1._content + 0x28) & 8) == 0 || ((*(byte *)(t2._content + 0x28) & 8) == 0)))) {
      if (*(int *)(t1._content + 8) != *(int *)(t2._content + 8)) {
        equals::stack._cursor = equals::stack._stack;
        return false;
      }
      uVar2 = *(uint *)(t1._content + 0xc);
      if (equals::stack._cursor == equals::stack._end) {
        Lib::Stack<Kernel::TermList_*>::expand(&equals::stack);
      }
      *equals::stack._cursor = (TermList *)(t1._content + 0x28 + (ulong)(uVar2 & 0xfffffff) * 8);
      equals::stack._cursor = equals::stack._cursor + 1;
      uVar2 = *(uint *)(t2._content + 0xc);
      if (equals::stack._cursor == equals::stack._end) {
        Lib::Stack<Kernel::TermList_*>::expand(&equals::stack);
      }
      *equals::stack._cursor = (TermList *)(t2._content + (ulong)(uVar2 & 0xfffffff) * 8 + 0x28);
      equals::stack._cursor = equals::stack._cursor + 1;
    }
    else if (t1._content != t2._content) {
      equals::stack._cursor = equals::stack._stack;
      return false;
    }
    if (equals::stack._cursor == equals::stack._stack) break;
    pTVar3 = equals::stack._cursor[-1];
    ppTVar1 = equals::stack._cursor + -2;
    pTVar4 = equals::stack._cursor[-2];
    equals::stack._cursor = ppTVar1;
    if ((pTVar3[-1]._content & 3) != 2) {
      if (ppTVar1 == equals::stack._end) {
        Lib::Stack<Kernel::TermList_*>::expand(&equals::stack);
      }
      *equals::stack._cursor = pTVar4 + -1;
      equals::stack._cursor = equals::stack._cursor + 1;
      if (equals::stack._cursor == equals::stack._end) {
        Lib::Stack<Kernel::TermList_*>::expand(&equals::stack);
      }
      *equals::stack._cursor = pTVar3 + -1;
      equals::stack._cursor = equals::stack._cursor + 1;
    }
    t1._content = pTVar4->_content;
    t2._content = pTVar3->_content;
  }
  return true;
}

Assistant:

bool TermList::equals(TermList t1, TermList t2)
{
  static Stack<TermList*> stack(8);
  ASS(stack.isEmpty());

  TermList* ss=&t1;
  TermList* tt=&t2;
  for(;;) {
    if (ss->isTerm() && tt->isTerm() && (!ss->term()->shared() || !tt->term()->shared())) {
      Term* s=ss->term();
      Term* t=tt->term();
      if (s->functor()!=t->functor()) {
        stack.reset();
        return false;
      }
      stack.push(s->args());
      stack.push(t->args());
    }
    else if (ss->content()!=tt->content()) {
      stack.reset();
      return false;
    }

    if (stack.isEmpty()) {
      break;
    }
    tt=stack.pop();
    ss=stack.pop();
    if (!tt->next()->isEmpty()) {
      stack.push(ss->next());
      stack.push(tt->next());
    }
  }
  return true;
}